

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomResources::read(DomResources *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  DomResource *this_00;
  size_t __nbytes_00;
  void *__buf_00;
  long lVar3;
  undefined4 in_register_00000034;
  QXmlStreamReader *this_01;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttribute *pQVar4;
  long in_FS_OFFSET;
  QStringView other;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QXmlStreamAttribute> local_50;
  long local_38;
  
  this_01 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  pQVar4 = local_50.ptr;
  for (lVar3 = 0; local_50.size * 0x68 != lVar3; lVar3 = lVar3 + 0x68) {
    local_68.m_data = *(storage_type_conflict **)(pQVar4 + 8);
    local_68.m_size = *(qsizetype *)(pQVar4 + 0x10);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"name",4);
    local_98.a.m_size = local_80.size;
    local_98.a.m_data = (char *)local_80.ptr;
    bVar1 = comparesEqual(&local_68,(QStringView *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    if (bVar1) {
      local_98.a.m_data = *(char **)(local_50.ptr + lVar3 + 0x50);
      local_98.a.m_size = *(qsizetype *)(local_50.ptr + lVar3 + 0x58);
      QStringView::toString((QString *)&local_80,(QStringView *)&local_98);
      setAttributeName(this,(QString *)&local_80);
    }
    else {
      local_98.a.m_size = 0x15;
      local_98.a.m_data = "Unexpected attribute ";
      local_98.b = &local_68;
      QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                ((QString *)&local_80,&local_98);
      QXmlStreamReader::raiseError((QString *)this_01);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    pQVar4 = pQVar4 + 0x68;
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError(this_01);
      if (bVar1) goto LAB_0014d7ee;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      local_68.m_size = -0x5555555555555556;
      local_68.m_data = (storage_type_conflict *)0xaaaaaaaaaaaaaaaa;
      local_68 = (QStringView)QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s((QString *)&local_80,L"include",7);
      __nbytes_00 = 0;
      other.m_data = local_80.ptr;
      other.m_size = local_80.size;
      iVar2 = QStringView::compare(&local_68,other,CaseInsensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      if (iVar2 == 0) {
        this_00 = (DomResource *)operator_new(0x20);
        (this_00->m_attr_location).d.d = (Data *)0x0;
        (this_00->m_attr_location).d.ptr = (char16_t *)0x0;
        (this_00->m_attr_location).d.size = 0;
        *(undefined8 *)&this_00->m_has_attr_location = 0;
        DomResource::read(this_00,__fd,__buf_00,__nbytes_00);
        QList<DomResource_*>::append(&this->m_include,this_00);
      }
      else {
        local_98.a.m_size = 0x13;
        local_98.a.m_data = "Unexpected element ";
        local_98.b = &local_68;
        QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                  ((QString *)&local_80,&local_98);
        QXmlStreamReader::raiseError((QString *)this_01);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      }
    }
  } while (iVar2 != 5);
LAB_0014d7ee:
  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomResources::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"name"_s) {
            setAttributeName(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"include"_s, Qt::CaseInsensitive)) {
                auto *v = new DomResource();
                v->read(reader);
                m_include.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}